

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapInsert(jx9_hashmap *pMap,jx9_value *pKey,jx9_value *pVal)

{
  char *pcVar1;
  char cVar2;
  jx9_vm *pjVar3;
  void *pvVar4;
  uint uVar5;
  sxi32 sVar6;
  ushort **ppuVar7;
  long lVar8;
  jx9_value *pObj;
  sxi32 sVar9;
  char *pcVar10;
  jx9_hashmap_node *pNode;
  jx9_hashmap_node *local_40;
  char *local_38;
  
  local_40 = (jx9_hashmap_node *)0x0;
  if ((pKey == (jx9_value *)0x0) || (pMap->nEntry != 0)) {
    if (pKey != (jx9_value *)0x0) {
      uVar5 = pKey->iFlags;
      goto LAB_0011aa0e;
    }
LAB_0011ab5b:
    sVar6 = HashmapInsertIntKey(pMap,pMap->iNextIdx,pVal);
    sVar9 = -1;
    if (sVar6 == 0) {
      pMap->iNextIdx = pMap->iNextIdx + 1;
      sVar9 = 0;
    }
  }
  else {
    uVar5 = pKey->iFlags;
    if ((uVar5 & 1) != 0) {
      *(byte *)&pMap->iFlags = (byte)pMap->iFlags | 1;
    }
LAB_0011aa0e:
    if ((uVar5 & 0x141) == 0) {
LAB_0011aaea:
      if ((pKey->iFlags & 2) == 0) {
        jx9MemObjToInteger(pKey);
      }
      sVar6 = HashmapLookupIntKey(pMap,(pKey->x).iVal,&local_40);
      if (sVar6 != 0) {
        sVar6 = HashmapInsertIntKey(pMap,(pKey->x).iVal,pVal);
        if (sVar6 != 0) {
          return -1;
        }
        lVar8 = (pKey->x).iVal;
        if (lVar8 < pMap->iNextIdx) {
          return 0;
        }
        while( true ) {
          pMap->iNextIdx = lVar8 + 1;
          sVar6 = HashmapLookupIntKey(pMap,lVar8 + 1,(jx9_hashmap_node **)0x0);
          if (sVar6 != 0) break;
          lVar8 = pMap->iNextIdx;
        }
        return 0;
      }
      pjVar3 = pMap->pVm;
      if ((pjVar3->aMemObj).nUsed <= local_40->nValIdx) {
        return 0;
      }
      pvVar4 = (pjVar3->aMemObj).pBase;
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      pObj = (jx9_value *)((long)pvVar4 + (ulong)(local_40->nValIdx * (pjVar3->aMemObj).eSize));
    }
    else {
      if ((uVar5 & 1) == 0) {
        jx9MemObjToString(pKey);
      }
      uVar5 = (pKey->sBlob).nByte;
      if ((ulong)uVar5 == 0) goto LAB_0011ab5b;
      local_38 = (char *)(pKey->sBlob).pBlob;
      cVar2 = *local_38;
      if ((int)uVar5 < 2 || cVar2 != '0') {
        pcVar1 = local_38 + uVar5;
        if ((cVar2 == '-') || (pcVar10 = local_38, cVar2 == '+')) {
          pcVar10 = local_38 + (uVar5 != 1);
        }
        if (pcVar10 < pcVar1) {
          do {
            cVar2 = *pcVar10;
            if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
               (ppuVar7 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar7 + (long)cVar2 * 2 + 1) & 8) == 0)) goto LAB_0011aa51;
            pcVar10 = pcVar10 + 1;
          } while (pcVar10 < pcVar1);
          if (pKey == (jx9_value *)0x0) goto LAB_0011ab5b;
        }
        goto LAB_0011aaea;
      }
LAB_0011aa51:
      sVar6 = HashmapLookupBlobKey(pMap,local_38,uVar5,&local_40);
      if (sVar6 != 0) {
        sVar6 = HashmapInsertBlobKey(pMap,(pKey->sBlob).pBlob,(pKey->sBlob).nByte,pVal);
        return sVar6;
      }
      pjVar3 = pMap->pVm;
      if ((pjVar3->aMemObj).nUsed <= local_40->nValIdx) {
        return 0;
      }
      pvVar4 = (pjVar3->aMemObj).pBase;
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      pObj = (jx9_value *)((long)pvVar4 + (ulong)(local_40->nValIdx * (pjVar3->aMemObj).eSize));
    }
    if (pVal == (jx9_value *)0x0) {
      sVar9 = 0;
      jx9MemObjRelease(pObj);
    }
    else {
      sVar9 = 0;
      jx9MemObjStore(pVal,pObj);
    }
  }
  return sVar9;
}

Assistant:

static sxi32 HashmapInsert(
	jx9_hashmap *pMap, /* Target hashmap */
	jx9_value *pKey,   /* Lookup key  */
	jx9_value *pVal    /* Node value */
	)
{
	jx9_hashmap_node *pNode = 0;
	sxi32 rc = SXRET_OK;
	if( pMap->nEntry < 1 && pKey && (pKey->iFlags & MEMOBJ_STRING) ){
		pMap->iFlags |= HASHMAP_JSON_OBJECT;
	}
	if( pKey && (pKey->iFlags & (MEMOBJ_STRING|MEMOBJ_HASHMAP|MEMOBJ_RES)) ){
		if( (pKey->iFlags & MEMOBJ_STRING) == 0 ){
			/* Force a string cast */
			jx9MemObjToString(&(*pKey));
		}
		if( SyBlobLength(&pKey->sBlob) < 1 || HashmapIsIntKey(&pKey->sBlob) ){
			if(SyBlobLength(&pKey->sBlob) < 1){
				/* Automatic index assign */
				pKey = 0;
			}
			goto IntKey;
		}
		if( SXRET_OK == HashmapLookupBlobKey(&(*pMap), SyBlobData(&pKey->sBlob), 
			SyBlobLength(&pKey->sBlob), &pNode) ){
				/* Overwrite the old value */
				jx9_value *pElem;
				pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
				if( pElem ){
					if( pVal ){
						jx9MemObjStore(pVal, pElem);
					}else{
						/* Nullify the entry */
						jx9MemObjToNull(pElem);
					}
				}
				return SXRET_OK;
		}
		/* Perform a blob-key insertion */
		rc = HashmapInsertBlobKey(&(*pMap),SyBlobData(&pKey->sBlob),SyBlobLength(&pKey->sBlob),&(*pVal));
		return rc;
	}
IntKey:
	if( pKey ){
		if((pKey->iFlags & MEMOBJ_INT) == 0 ){
			/* Force an integer cast */
			jx9MemObjToInteger(pKey);
		}
		if( SXRET_OK == HashmapLookupIntKey(&(*pMap), pKey->x.iVal, &pNode) ){
			/* Overwrite the old value */
			jx9_value *pElem;
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
			if( pElem ){
				if( pVal ){
					jx9MemObjStore(pVal, pElem);
				}else{
					/* Nullify the entry */
					jx9MemObjToNull(pElem);
				}
			}
			return SXRET_OK;
		}
		/* Perform a 64-bit-int-key insertion */
		rc = HashmapInsertIntKey(&(*pMap), pKey->x.iVal, &(*pVal));
		if( rc == SXRET_OK ){
			if( pKey->x.iVal >= pMap->iNextIdx ){
				/* Increment the automatic index */ 
				pMap->iNextIdx = pKey->x.iVal + 1;
				/* Make sure the automatic index is not reserved */
				while( SXRET_OK == HashmapLookupIntKey(&(*pMap), pMap->iNextIdx, 0) ){
					pMap->iNextIdx++;
				}
			}
		}
	}else{
		/* Assign an automatic index */
		rc = HashmapInsertIntKey(&(*pMap),pMap->iNextIdx,&(*pVal));
		if( rc == SXRET_OK ){
			++pMap->iNextIdx;
		}
	}
	/* Insertion result */
	return rc;
}